

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCollisionAlgorithm.cpp
# Opt level: O3

btScalar __thiscall
btCompoundCollisionAlgorithm::calculateTimeOfImpact
          (btCompoundCollisionAlgorithm *this,btCollisionObject *body0,btCollisionObject *body1,
          btDispatcherInfo *dispatchInfo,btManifoldResult *resultOut)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  btCollisionShape *pbVar12;
  void *pvVar13;
  btCollisionAlgorithm *pbVar14;
  undefined1 auVar15 [16];
  int iVar16;
  btCollisionObject *pbVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  float fVar21;
  float extraout_XMM0_Da;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  
  pbVar17 = body1;
  if (this->m_isSwapped != false) {
    pbVar17 = body0;
    body0 = body1;
  }
  lVar19 = (long)(this->m_childCollisionAlgorithms).m_size;
  if (lVar19 < 1) {
    fVar22 = 1.0;
  }
  else {
    pbVar12 = body0->m_collisionShape;
    auVar8 = *(undefined1 (*) [16])(body0->m_worldTransform).m_basis.m_el[0].m_floats;
    fVar21 = auVar8._0_4_;
    fVar23 = auVar8._4_4_;
    fVar24 = auVar8._8_4_;
    auVar9 = *(undefined1 (*) [16])(body0->m_worldTransform).m_basis.m_el[1].m_floats;
    fVar25 = auVar9._0_4_;
    fVar27 = auVar9._4_4_;
    fVar28 = auVar9._8_4_;
    auVar10 = *(undefined1 (*) [16])(body0->m_worldTransform).m_basis.m_el[2].m_floats;
    fVar29 = auVar10._0_4_;
    fVar30 = auVar10._4_4_;
    fVar31 = auVar10._8_4_;
    auVar11 = *(undefined1 (*) [16])(body0->m_worldTransform).m_origin.m_floats;
    iVar16 = body0->m_updateRevision;
    lVar20 = 0x38;
    lVar18 = 0;
    fVar26 = 1.0;
    do {
      pvVar13 = pbVar12[1].m_userPointer;
      fVar22 = *(float *)((long)pvVar13 + lVar20 + -0x30);
      fVar1 = *(float *)((long)pvVar13 + lVar20 + -0x20);
      fVar2 = *(float *)((long)pvVar13 + lVar20 + -0x10);
      fVar3 = *(float *)((long)pvVar13 + lVar20 + -8);
      fVar4 = *(float *)((long)pvVar13 + lVar20 + -4);
      fVar5 = *(float *)((long)pvVar13 + lVar20);
      local_178._0_4_ = auVar11._0_4_;
      local_178._4_4_ = auVar11._4_4_;
      body0->m_updateRevision = iVar16 + 1;
      uVar6 = *(undefined8 *)((long)pvVar13 + lVar20 + -0x38);
      fVar32 = (float)uVar6;
      fVar33 = (float)((ulong)uVar6 >> 0x20);
      uVar6 = *(undefined8 *)((long)pvVar13 + lVar20 + -0x28);
      uVar7 = *(undefined8 *)((long)pvVar13 + lVar20 + -0x18);
      fVar36 = (float)uVar6;
      fVar37 = (float)((ulong)uVar6 >> 0x20);
      fVar34 = (float)uVar7;
      fVar35 = (float)((ulong)uVar7 >> 0x20);
      *(ulong *)(body0->m_worldTransform).m_basis.m_el[0].m_floats =
           CONCAT44(fVar35 * fVar24 + fVar33 * fVar21 + fVar23 * fVar37,
                    fVar34 * fVar24 + fVar32 * fVar21 + fVar23 * fVar36);
      (body0->m_worldTransform).m_basis.m_el[0].m_floats[2] =
           fVar2 * fVar24 + fVar22 * fVar21 + fVar23 * fVar1;
      (body0->m_worldTransform).m_basis.m_el[0].m_floats[3] = 0.0;
      *(ulong *)(body0->m_worldTransform).m_basis.m_el[1].m_floats =
           CONCAT44(fVar35 * fVar28 + fVar33 * fVar25 + fVar27 * fVar37,
                    fVar34 * fVar28 + fVar32 * fVar25 + fVar27 * fVar36);
      (body0->m_worldTransform).m_basis.m_el[1].m_floats[2] =
           fVar2 * fVar28 + fVar22 * fVar25 + fVar27 * fVar1;
      (body0->m_worldTransform).m_basis.m_el[1].m_floats[3] = 0.0;
      *(ulong *)(body0->m_worldTransform).m_basis.m_el[2].m_floats =
           CONCAT44(fVar35 * fVar31 + fVar33 * fVar29 + fVar37 * fVar30,
                    fVar34 * fVar31 + fVar32 * fVar29 + fVar36 * fVar30);
      (body0->m_worldTransform).m_basis.m_el[2].m_floats[2] =
           fVar2 * fVar31 + fVar22 * fVar29 + fVar1 * fVar30;
      (body0->m_worldTransform).m_basis.m_el[2].m_floats[3] = 0.0;
      auVar15._4_4_ = fVar5 * fVar28 + fVar3 * fVar25 + fVar4 * fVar27 + local_178._4_4_;
      auVar15._0_4_ = fVar5 * fVar24 + fVar3 * fVar21 + fVar4 * fVar23 + (float)local_178;
      auVar15._8_4_ = fVar5 * fVar31 + fVar3 * fVar29 + fVar30 * fVar4 + auVar11._8_4_;
      auVar15._12_4_ = 0;
      *(undefined1 (*) [16])(body0->m_worldTransform).m_origin.m_floats = auVar15;
      pbVar14 = (this->m_childCollisionAlgorithms).m_data[lVar18];
      (*pbVar14->_vptr_btCollisionAlgorithm[3])(pbVar14,body0,pbVar17,dispatchInfo,resultOut);
      fVar22 = extraout_XMM0_Da;
      if (fVar26 <= extraout_XMM0_Da) {
        fVar22 = fVar26;
      }
      iVar16 = body0->m_updateRevision + 1;
      body0->m_updateRevision = iVar16;
      local_148 = auVar8._0_8_;
      *(undefined8 *)(body0->m_worldTransform).m_basis.m_el[0].m_floats = local_148;
      *(long *)((body0->m_worldTransform).m_basis.m_el[0].m_floats + 2) = auVar8._8_8_;
      local_158 = auVar9._0_8_;
      *(undefined8 *)(body0->m_worldTransform).m_basis.m_el[1].m_floats = local_158;
      *(long *)((body0->m_worldTransform).m_basis.m_el[1].m_floats + 2) = auVar9._8_8_;
      local_168 = auVar10._0_8_;
      *(undefined8 *)(body0->m_worldTransform).m_basis.m_el[2].m_floats = local_168;
      *(long *)((body0->m_worldTransform).m_basis.m_el[2].m_floats + 2) = auVar10._8_8_;
      local_178 = auVar11._0_8_;
      *(undefined8 *)(body0->m_worldTransform).m_origin.m_floats = local_178;
      *(long *)((body0->m_worldTransform).m_origin.m_floats + 2) = auVar11._8_8_;
      lVar18 = lVar18 + 1;
      lVar20 = lVar20 + 0x58;
      fVar26 = fVar22;
    } while (lVar19 != lVar18);
  }
  return fVar22;
}

Assistant:

btScalar	btCompoundCollisionAlgorithm::calculateTimeOfImpact(btCollisionObject* body0,btCollisionObject* body1,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	btAssert(0);
	//needs to be fixed, using btCollisionObjectWrapper and NOT modifying internal data structures
	btCollisionObject* colObj = m_isSwapped? body1 : body0;
	btCollisionObject* otherObj = m_isSwapped? body0 : body1;

	btAssert (colObj->getCollisionShape()->isCompound());
	
	btCompoundShape* compoundShape = static_cast<btCompoundShape*>(colObj->getCollisionShape());

	//We will use the OptimizedBVH, AABB tree to cull potential child-overlaps
	//If both proxies are Compound, we will deal with that directly, by performing sequential/parallel tree traversals
	//given Proxy0 and Proxy1, if both have a tree, Tree0 and Tree1, this means:
	//determine overlapping nodes of Proxy1 using Proxy0 AABB against Tree1
	//then use each overlapping node AABB against Tree0
	//and vise versa.

	btScalar hitFraction = btScalar(1.);

	int numChildren = m_childCollisionAlgorithms.size();
	int i;
    btTransform	orgTrans;
    btScalar frac;
	for (i=0;i<numChildren;i++)
	{
		//btCollisionShape* childShape = compoundShape->getChildShape(i);

		//backup
        orgTrans = colObj->getWorldTransform();
	
		const btTransform& childTrans = compoundShape->getChildTransform(i);
		//btTransform	newChildWorldTrans = orgTrans*childTrans ;
		colObj->setWorldTransform( orgTrans*childTrans );

		//btCollisionShape* tmpShape = colObj->getCollisionShape();
		//colObj->internalSetTemporaryCollisionShape( childShape );
        frac = m_childCollisionAlgorithms[i]->calculateTimeOfImpact(colObj,otherObj,dispatchInfo,resultOut);
		if (frac<hitFraction)
		{
			hitFraction = frac;
		}
		//revert back
		//colObj->internalSetTemporaryCollisionShape( tmpShape);
		colObj->setWorldTransform( orgTrans);
	}
	return hitFraction;

}